

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O2

int __thiscall
QMakeProperty::queryProperty
          (QMakeProperty *this,QStringList *optionProperties,PropertyPrinter *printer)

{
  long lVar1;
  bool bVar2;
  QString *prop;
  QString *pQVar3;
  int iVar4;
  ProString *other;
  long lVar5;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  QByteArrayView QVar7;
  QStringBuilder<const_QString_&,_const_char_(&)[5]> local_1f0;
  QArrayDataPointer<char16_t> local_1e0;
  ProString local_1c8;
  ProString dval;
  ProString sval;
  ProString gval;
  ProString pval;
  QByteArrayView local_d8;
  QArrayDataPointer<QString> local_c8;
  QArrayDataPointer<QString> local_a8;
  QArrayDataPointer<std::pair<QString,_QString>_> local_88;
  ProKey pkey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.size = 0;
  local_88.d = (Data *)0x0;
  local_88.ptr = (pair<QString,_QString> *)0x0;
  lVar5 = (optionProperties->d).size;
  if (lVar5 == 0) {
    initSettings(this);
    local_a8.size = -0x5555555555555556;
    local_a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_a8.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
    QSettings::childKeys();
    pQVar3 = local_a8.ptr;
    for (lVar5 = local_a8.size * 0x18; lVar5 != 0; lVar5 = lVar5 + -0x18) {
      pval.m_string.d.size = -0x5555555555555556;
      pval.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      pval.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      QVar6.m_size = (size_t)this->settings;
      QVar6.field_0.m_data = &pkey;
      QSettings::value(QVar6);
      QVariant::toString();
      QVariant::~QVariant((QVariant *)&pkey);
      std::pair<QString,_QString>::pair<QString_&,_true>
                ((pair<QString,_QString> *)&pkey,pQVar3,&pval.m_string);
      QList<std::pair<QString,QString>>::emplaceBack<std::pair<QString,QString>>
                ((QList<std::pair<QString,QString>> *)&local_88,(pair<QString,_QString> *)&pkey);
      std::pair<QString,_QString>::~pair((pair<QString,_QString> *)&pkey);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pval);
      pQVar3 = pQVar3 + 1;
    }
    local_c8.d = (Data *)0x0;
    local_c8.ptr = (QString *)0x0;
    local_c8.size = 0;
    for (lVar5 = 0; lVar5 != 0x170; lVar5 = lVar5 + 0x10) {
      QByteArrayView::QByteArrayView<const_char_*,_true>
                (&local_d8,(char **)((long)&propList[0].name + lVar5));
      QVar7.m_data = (storage_type *)local_d8.m_size;
      QVar7.m_size = (qsizetype)&pkey;
      QString::fromLatin1(QVar7);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_c8,(QString *)&pkey);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pkey);
    }
    QString::QString((QString *)&pkey,"QMAKE_VERSION");
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_c8,(QString *)&pkey);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pkey);
    QString::QString((QString *)&pkey,"QT_VERSION");
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_c8,(QString *)&pkey);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pkey);
    pQVar3 = local_c8.ptr;
    for (lVar5 = local_c8.size * 0x18; lVar5 != 0; lVar5 = lVar5 + -0x18) {
      pkey.super_ProString.m_file = -0x55555556;
      pkey.super_ProString._36_4_ = 0xaaaaaaaa;
      pkey.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
      pkey.super_ProString.m_string.d.size = -0x5555555555555556;
      pkey.super_ProString.m_offset = -0x55555556;
      pkey.super_ProString.m_length = -0x55555556;
      pkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      pkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      ProKey::ProKey((ProKey *)&pval,pQVar3);
      value(&pkey.super_ProString,this,(ProKey *)&pval);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pval);
      pval.m_file = -0x55555556;
      pval._36_4_ = 0xaaaaaaaa;
      pval.m_hash = 0xaaaaaaaaaaaaaaaa;
      pval.m_string.d.size = -0x5555555555555556;
      pval.m_offset = -0x55555556;
      pval.m_length = -0x55555556;
      pval.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      pval.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      sval.m_string.d.ptr = L"/raw";
      sval.m_string.d.d = (Data *)pQVar3;
      ProString::ProString<QString_const&,char_const(&)[5]>
                (&gval,(QStringBuilder<const_QString_&,_const_char_(&)[5]> *)&sval);
      value(&pval,this,(ProKey *)&gval);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&gval);
      gval.m_file = -0x55555556;
      gval._36_4_ = 0xaaaaaaaa;
      gval.m_hash = 0xaaaaaaaaaaaaaaaa;
      gval.m_string.d.size = -0x5555555555555556;
      gval.m_offset = -0x55555556;
      gval.m_length = -0x55555556;
      gval.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      gval.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      dval.m_string.d.ptr = L"/get";
      dval.m_string.d.d = (Data *)pQVar3;
      ProString::ProString<QString_const&,char_const(&)[5]>
                (&sval,(QStringBuilder<const_QString_&,_const_char_(&)[5]> *)&dval);
      value(&gval,this,(ProKey *)&sval);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&sval);
      sval.m_file = -0x55555556;
      sval._36_4_ = 0xaaaaaaaa;
      sval.m_hash = 0xaaaaaaaaaaaaaaaa;
      sval.m_string.d.size = -0x5555555555555556;
      sval.m_offset = -0x55555556;
      sval.m_length = -0x55555556;
      sval.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      sval.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_1c8.m_string.d.ptr = L"/src";
      local_1c8.m_string.d.d = (Data *)pQVar3;
      ProString::ProString<QString_const&,char_const(&)[5]>
                (&dval,(QStringBuilder<const_QString_&,_const_char_(&)[5]> *)&local_1c8);
      value(&sval,this,(ProKey *)&dval);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dval);
      dval.m_file = -0x55555556;
      dval._36_4_ = 0xaaaaaaaa;
      dval.m_hash = 0xaaaaaaaaaaaaaaaa;
      dval.m_string.d.size = -0x5555555555555556;
      dval.m_offset = -0x55555556;
      dval.m_length = -0x55555556;
      dval.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      dval.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_1e0.ptr = L"/dev";
      local_1e0.d = (Data *)pQVar3;
      ProString::ProString<QString_const&,char_const(&)[5]>
                (&local_1c8,(QStringBuilder<const_QString_&,_const_char_(&)[5]> *)&local_1e0);
      value(&dval,this,(ProKey *)&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1c8);
      ProString::toQString((QString *)&local_1e0,&pkey.super_ProString);
      std::pair<QString,_QString>::pair<QString,_true>
                ((pair<QString,_QString> *)&local_1c8,pQVar3,(QString *)&local_1e0);
      QList<std::pair<QString,QString>>::emplaceBack<std::pair<QString,QString>>
                ((QList<std::pair<QString,QString>> *)&local_88,(pair<QString,_QString> *)&local_1c8
                );
      std::pair<QString,_QString>::~pair((pair<QString,_QString> *)&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e0);
      if ((pval.m_length != 0) &&
         (bVar2 = ProString::operator!=(&pval,&pkey.super_ProString), bVar2)) {
        local_1f0.b = (char (*) [5])0x112647;
        local_1f0.a = pQVar3;
        ProString::toQString((QString *)&local_1e0,&pval);
        std::pair<QString,_QString>::
        pair<QStringBuilder<const_QString_&,_const_char_(&)[5]>,_QString,_true>
                  ((pair<QString,_QString> *)&local_1c8,&local_1f0,(QString *)&local_1e0);
        QList<std::pair<QString,QString>>::emplaceBack<std::pair<QString,QString>>
                  ((QList<std::pair<QString,QString>> *)&local_88,
                   (pair<QString,_QString> *)&local_1c8);
        std::pair<QString,_QString>::~pair((pair<QString,_QString> *)&local_1c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e0);
      }
      if (gval.m_length != 0) {
        other = &pval;
        if (pval.m_length == 0) {
          other = &pkey.super_ProString;
        }
        bVar2 = ProString::operator!=(&gval,other);
        if (bVar2) {
          local_1f0.b = (char (*) [5])0x11263d;
          local_1f0.a = pQVar3;
          ProString::toQString((QString *)&local_1e0,&gval);
          std::pair<QString,_QString>::
          pair<QStringBuilder<const_QString_&,_const_char_(&)[5]>,_QString,_true>
                    ((pair<QString,_QString> *)&local_1c8,&local_1f0,(QString *)&local_1e0);
          QList<std::pair<QString,QString>>::emplaceBack<std::pair<QString,QString>>
                    ((QList<std::pair<QString,QString>> *)&local_88,
                     (pair<QString,_QString> *)&local_1c8);
          std::pair<QString,_QString>::~pair((pair<QString,_QString> *)&local_1c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e0);
        }
      }
      if ((sval.m_length != 0) && (bVar2 = ProString::operator!=(&sval,&gval), bVar2)) {
        local_1f0.b = (char (*) [5])0x112638;
        local_1f0.a = pQVar3;
        ProString::toQString((QString *)&local_1e0,&sval);
        std::pair<QString,_QString>::
        pair<QStringBuilder<const_QString_&,_const_char_(&)[5]>,_QString,_true>
                  ((pair<QString,_QString> *)&local_1c8,&local_1f0,(QString *)&local_1e0);
        QList<std::pair<QString,QString>>::emplaceBack<std::pair<QString,QString>>
                  ((QList<std::pair<QString,QString>> *)&local_88,
                   (pair<QString,_QString> *)&local_1c8);
        std::pair<QString,_QString>::~pair((pair<QString,_QString> *)&local_1c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e0);
      }
      if ((dval.m_length != 0) && (bVar2 = ProString::operator!=(&dval,&pval), bVar2)) {
        local_1f0.b = (char (*) [5])0x112642;
        local_1f0.a = pQVar3;
        ProString::toQString((QString *)&local_1e0,&dval);
        std::pair<QString,_QString>::
        pair<QStringBuilder<const_QString_&,_const_char_(&)[5]>,_QString,_true>
                  ((pair<QString,_QString> *)&local_1c8,&local_1f0,(QString *)&local_1e0);
        QList<std::pair<QString,QString>>::emplaceBack<std::pair<QString,QString>>
                  ((QList<std::pair<QString,QString>> *)&local_88,
                   (pair<QString,_QString> *)&local_1c8);
        std::pair<QString,_QString>::~pair((pair<QString,_QString> *)&local_1c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e0);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dval);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&sval);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&gval);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pval);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pkey);
      pQVar3 = pQVar3 + 1;
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_c8);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
    iVar4 = 0;
  }
  else {
    pQVar3 = (optionProperties->d).ptr;
    iVar4 = 0;
    for (lVar5 = lVar5 * 0x18; lVar5 != 0; lVar5 = lVar5 + -0x18) {
      pkey.super_ProString.m_file = -0x55555556;
      pkey.super_ProString._36_4_ = 0xaaaaaaaa;
      pkey.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
      pkey.super_ProString.m_string.d.size = -0x5555555555555556;
      pkey.super_ProString.m_offset = -0x55555556;
      pkey.super_ProString.m_length = -0x55555556;
      pkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      pkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      ProKey::ProKey(&pkey,pQVar3);
      bVar2 = hasValue(this,&pkey);
      if (bVar2) {
        value(&gval,this,&pkey);
        ProString::toQString(&sval.m_string,&gval);
        std::pair<QString,_QString>::pair<QString,_true>
                  ((pair<QString,_QString> *)&pval,pQVar3,&sval.m_string);
        QList<std::pair<QString,QString>>::emplaceBack<std::pair<QString,QString>>
                  ((QList<std::pair<QString,QString>> *)&local_88,(pair<QString,_QString> *)&pval);
        std::pair<QString,_QString>::~pair((pair<QString,_QString> *)&pval);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&sval);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&gval);
      }
      else {
        QString::QString(&gval.m_string,"**Unknown**");
        std::pair<QString,_QString>::pair<QString,_true>
                  ((pair<QString,_QString> *)&pval,pQVar3,&gval.m_string);
        QList<std::pair<QString,QString>>::emplaceBack<std::pair<QString,QString>>
                  ((QList<std::pair<QString,QString>> *)&local_88,(pair<QString,_QString> *)&pval);
        std::pair<QString,_QString>::~pair((pair<QString,_QString> *)&pval);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&gval);
        iVar4 = 0x65;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pkey);
      pQVar3 = pQVar3 + 1;
    }
  }
  std::function<void_(const_QList<std::pair<QString,_QString>_>_&)>::operator()
            (printer,(QList<std::pair<QString,_QString>_> *)&local_88);
  QArrayDataPointer<std::pair<QString,_QString>_>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int QMakeProperty::queryProperty(const QStringList &optionProperties,
                                 const PropertyPrinter &printer)
{
    QList<QPair<QString, QString>> output;
    int ret = PropSuccessRetCode;
    if (optionProperties.isEmpty()) {
        initSettings();
        const auto keys = settings->childKeys();
        for (const QString &key : keys) {
            QString val = settings->value(key).toString();
            output.append({ key, val });
        }
        QStringList specialProps;
        for (unsigned i = 0; i < sizeof(propList) / sizeof(propList[0]); i++)
            specialProps.append(QString::fromLatin1(propList[i].name));
#ifdef QMAKE_VERSION_STR
        specialProps.append("QMAKE_VERSION");
#endif
#ifdef QT_VERSION_STR
        specialProps.append("QT_VERSION");
#endif
        for (const QString &prop : std::as_const(specialProps)) {
            ProString val = value(ProKey(prop));
            ProString pval = value(ProKey(prop + "/raw"));
            ProString gval = value(ProKey(prop + "/get"));
            ProString sval = value(ProKey(prop + "/src"));
            ProString dval = value(ProKey(prop + "/dev"));
            output.append({ prop, val.toQString() });
            if (!pval.isEmpty() && pval != val)
                output.append({ prop + "/raw", pval.toQString() });
            if (!gval.isEmpty() && gval != (pval.isEmpty() ? val : pval))
                output.append({ prop + "/get", gval.toQString() });
            if (!sval.isEmpty() && sval != gval)
                output.append({ prop + "/src", sval.toQString() });
            if (!dval.isEmpty() && dval != pval)
                output.append({ prop + "/dev", dval.toQString() });
        }
    } else {
        for (const auto &prop : optionProperties) {
            const ProKey pkey(prop);
            if (!hasValue(pkey)) {
                ret = PropFailRetCode;
                output.append({ prop, QString("**Unknown**") });
            } else {
                output.append({ prop, value(pkey).toQString() });
            }
        }
    }
    printer(output);
    return ret;
}